

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

InsertResult __thiscall
wasm::OrderedFixedStorage<unsigned_int,_3UL>::insert
          (OrderedFixedStorage<unsigned_int,_3UL> *this,uint *x)

{
  value_type_conflict2 vVar1;
  reference pvVar2;
  bool bVar3;
  ulong local_30;
  size_t j;
  size_t i;
  uint *x_local;
  OrderedFixedStorage<unsigned_int,_3UL> *this_local;
  
  j = 0;
  while( true ) {
    bVar3 = false;
    if (j < (this->super_FixedStorageBase<unsigned_int,_3UL>).used) {
      pvVar2 = std::array<unsigned_int,_3UL>::operator[]
                         (&(this->super_FixedStorageBase<unsigned_int,_3UL>).storage,j);
      bVar3 = *pvVar2 < *x;
    }
    if (!bVar3) break;
    j = j + 1;
  }
  if ((j < (this->super_FixedStorageBase<unsigned_int,_3UL>).used) &&
     (pvVar2 = std::array<unsigned_int,_3UL>::operator[]
                         (&(this->super_FixedStorageBase<unsigned_int,_3UL>).storage,j),
     *pvVar2 == *x)) {
    this_local._4_4_ = NoError;
  }
  else {
    if (3 < (this->super_FixedStorageBase<unsigned_int,_3UL>).used) {
      __assert_fail("this->used <= N",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                    ,99,
                    "InsertResult wasm::OrderedFixedStorage<unsigned int, 3>::insert(const T &) [T = unsigned int, N = 3]"
                   );
    }
    if ((this->super_FixedStorageBase<unsigned_int,_3UL>).used == 3) {
      this_local._4_4_ = CouldNotInsert;
    }
    else {
      if (j != (this->super_FixedStorageBase<unsigned_int,_3UL>).used) {
        for (local_30 = (this->super_FixedStorageBase<unsigned_int,_3UL>).used; j + 1 <= local_30;
            local_30 = local_30 - 1) {
          pvVar2 = std::array<unsigned_int,_3UL>::operator[]
                             (&(this->super_FixedStorageBase<unsigned_int,_3UL>).storage,
                              local_30 - 1);
          vVar1 = *pvVar2;
          pvVar2 = std::array<unsigned_int,_3UL>::operator[]
                             (&(this->super_FixedStorageBase<unsigned_int,_3UL>).storage,local_30);
          *pvVar2 = vVar1;
        }
      }
      vVar1 = *x;
      pvVar2 = std::array<unsigned_int,_3UL>::operator[]
                         (&(this->super_FixedStorageBase<unsigned_int,_3UL>).storage,j);
      *pvVar2 = vVar1;
      (this->super_FixedStorageBase<unsigned_int,_3UL>).used =
           (this->super_FixedStorageBase<unsigned_int,_3UL>).used + 1;
      this_local._4_4_ = NoError;
    }
  }
  return this_local._4_4_;
}

Assistant:

InsertResult insert(const T& x) {
    // Find the insertion point |i| where x should be placed.
    size_t i = 0;
    while (i < this->used && this->storage[i] < x) {
      i++;
    }
    if (i < this->used && this->storage[i] == x) {
      // The item already exists.
      return InsertResult::NoError;
    }
    // |i| is now the location where x should be placed.

    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }

    if (i != this->used) {
      // Push things forward to make room for x.
      for (size_t j = this->used; j >= i + 1; j--) {
        this->storage[j] = this->storage[j - 1];
      }
    }

    this->storage[i] = x;
    this->used++;
    return InsertResult::NoError;
  }